

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

void mpc_undefine_unretained(mpc_parser_t *p,int force)

{
  int force_local;
  mpc_parser_t *p_local;
  
  if ((p->retained == '\0') || (force != 0)) {
    switch(p->type) {
    case '\x02':
      free((p->data).lift.lf);
      break;
    default:
      break;
    case '\x05':
      mpc_undefine_unretained((p->data).expect.x,0);
      free((p->data).lift.x);
      break;
    case '\n':
    case '\v':
    case '\x0e':
      free((p->data).lift.lf);
      break;
    case '\x0f':
      mpc_undefine_unretained((p->data).expect.x,0);
      break;
    case '\x10':
      mpc_undefine_unretained((p->data).expect.x,0);
      break;
    case '\x11':
      mpc_undefine_unretained((p->data).expect.x,0);
      break;
    case '\x12':
    case '\x13':
      mpc_undefine_unretained((p->data).expect.x,0);
      break;
    case '\x14':
    case '\x15':
    case '\x16':
      mpc_undefine_unretained((p->data).repeat.x,0);
      break;
    case '\x17':
      mpc_undefine_or(p);
      break;
    case '\x18':
      mpc_undefine_and(p);
      break;
    case '\x19':
      mpc_undefine_unretained((p->data).expect.x,0);
      free((p->data).check_with.d);
      break;
    case '\x1a':
      mpc_undefine_unretained((p->data).expect.x,0);
      free((p->data).check_with.e);
    }
    if (force == 0) {
      free(p->name);
      free(p);
    }
  }
  return;
}

Assistant:

static void mpc_undefine_unretained(mpc_parser_t *p, int force) {

  if (p->retained && !force) { return; }

  switch (p->type) {

    case MPC_TYPE_FAIL: free(p->data.fail.m); break;

    case MPC_TYPE_ONEOF:
    case MPC_TYPE_NONEOF:
    case MPC_TYPE_STRING:
      free(p->data.string.x);
      break;

    case MPC_TYPE_APPLY:    mpc_undefine_unretained(p->data.apply.x, 0);    break;
    case MPC_TYPE_APPLY_TO: mpc_undefine_unretained(p->data.apply_to.x, 0); break;
    case MPC_TYPE_PREDICT:  mpc_undefine_unretained(p->data.predict.x, 0);  break;

    case MPC_TYPE_MAYBE:
    case MPC_TYPE_NOT:
      mpc_undefine_unretained(p->data.not.x, 0);
      break;

    case MPC_TYPE_EXPECT:
      mpc_undefine_unretained(p->data.expect.x, 0);
      free(p->data.expect.m);
      break;

    case MPC_TYPE_MANY:
    case MPC_TYPE_MANY1:
    case MPC_TYPE_COUNT:
      mpc_undefine_unretained(p->data.repeat.x, 0);
      break;

    case MPC_TYPE_OR:  mpc_undefine_or(p);  break;
    case MPC_TYPE_AND: mpc_undefine_and(p); break;

    case MPC_TYPE_CHECK:
      mpc_undefine_unretained(p->data.check.x, 0);
      free(p->data.check.e);
      break;

    case MPC_TYPE_CHECK_WITH:
      mpc_undefine_unretained(p->data.check_with.x, 0);
      free(p->data.check_with.e);
      break;

    default: break;
  }

  if (!force) {
    free(p->name);
    free(p);
  }

}